

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_calc_finished_tls_sha256(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  int iVar1;
  uchar local_48 [8];
  uchar padbuf [32];
  int from_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  iVar1 = ssl_calc_finished_tls_generic(ssl,&ssl->handshake->fin_sha256,local_48,0x20,buf,from);
  return iVar1;
}

Assistant:

static int ssl_calc_finished_tls_sha256(
    mbedtls_ssl_context *ssl, unsigned char *buf, int from)
{
    unsigned char padbuf[32];
    return ssl_calc_finished_tls_generic(ssl,
#if defined(MBEDTLS_USE_PSA_CRYPTO)
                                         &ssl->handshake->fin_sha256_psa,
#else
                                         &ssl->handshake->fin_sha256,
#endif
                                         padbuf, sizeof(padbuf),
                                         buf, from);
}